

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

void precomp_get_consttime(uint64_t *table,uint64_t bits_l,uint64_t *tmp)

{
  uint64_t uVar1;
  uint64_t x_224;
  uint64_t *os_224;
  uint64_t x_223;
  uint64_t *os_223;
  uint64_t x_222;
  uint64_t *os_222;
  uint64_t x_221;
  uint64_t *os_221;
  uint64_t x_220;
  uint64_t *os_220;
  uint64_t x_219;
  uint64_t *os_219;
  uint64_t x_218;
  uint64_t *os_218;
  uint64_t x_217;
  uint64_t *os_217;
  uint64_t x_216;
  uint64_t *os_216;
  uint64_t x_215;
  uint64_t *os_215;
  uint64_t x_214;
  uint64_t *os_214;
  uint64_t x_213;
  uint64_t *os_213;
  uint64_t x_212;
  uint64_t *os_212;
  uint64_t x_211;
  uint64_t *os_211;
  uint64_t x_210;
  uint64_t *os_210;
  uint32_t i_14;
  uint64_t *res_j_14;
  uint64_t c_14;
  uint64_t x_209;
  uint64_t *os_209;
  uint64_t x_208;
  uint64_t *os_208;
  uint64_t x_207;
  uint64_t *os_207;
  uint64_t x_206;
  uint64_t *os_206;
  uint64_t x_205;
  uint64_t *os_205;
  uint64_t x_204;
  uint64_t *os_204;
  uint64_t x_203;
  uint64_t *os_203;
  uint64_t x_202;
  uint64_t *os_202;
  uint64_t x_201;
  uint64_t *os_201;
  uint64_t x_200;
  uint64_t *os_200;
  uint64_t x_199;
  uint64_t *os_199;
  uint64_t x_198;
  uint64_t *os_198;
  uint64_t x_197;
  uint64_t *os_197;
  uint64_t x_196;
  uint64_t *os_196;
  uint64_t x_195;
  uint64_t *os_195;
  uint32_t i_13;
  uint64_t *res_j_13;
  uint64_t c_13;
  uint64_t x_194;
  uint64_t *os_194;
  uint64_t x_193;
  uint64_t *os_193;
  uint64_t x_192;
  uint64_t *os_192;
  uint64_t x_191;
  uint64_t *os_191;
  uint64_t x_190;
  uint64_t *os_190;
  uint64_t x_189;
  uint64_t *os_189;
  uint64_t x_188;
  uint64_t *os_188;
  uint64_t x_187;
  uint64_t *os_187;
  uint64_t x_186;
  uint64_t *os_186;
  uint64_t x_185;
  uint64_t *os_185;
  uint64_t x_184;
  uint64_t *os_184;
  uint64_t x_183;
  uint64_t *os_183;
  uint64_t x_182;
  uint64_t *os_182;
  uint64_t x_181;
  uint64_t *os_181;
  uint64_t x_180;
  uint64_t *os_180;
  uint32_t i_12;
  uint64_t *res_j_12;
  uint64_t c_12;
  uint64_t x_179;
  uint64_t *os_179;
  uint64_t x_178;
  uint64_t *os_178;
  uint64_t x_177;
  uint64_t *os_177;
  uint64_t x_176;
  uint64_t *os_176;
  uint64_t x_175;
  uint64_t *os_175;
  uint64_t x_174;
  uint64_t *os_174;
  uint64_t x_173;
  uint64_t *os_173;
  uint64_t x_172;
  uint64_t *os_172;
  uint64_t x_171;
  uint64_t *os_171;
  uint64_t x_170;
  uint64_t *os_170;
  uint64_t x_169;
  uint64_t *os_169;
  uint64_t x_168;
  uint64_t *os_168;
  uint64_t x_167;
  uint64_t *os_167;
  uint64_t x_166;
  uint64_t *os_166;
  uint64_t x_165;
  uint64_t *os_165;
  uint32_t i_11;
  uint64_t *res_j_11;
  uint64_t c_11;
  uint64_t x_164;
  uint64_t *os_164;
  uint64_t x_163;
  uint64_t *os_163;
  uint64_t x_162;
  uint64_t *os_162;
  uint64_t x_161;
  uint64_t *os_161;
  uint64_t x_160;
  uint64_t *os_160;
  uint64_t x_159;
  uint64_t *os_159;
  uint64_t x_158;
  uint64_t *os_158;
  uint64_t x_157;
  uint64_t *os_157;
  uint64_t x_156;
  uint64_t *os_156;
  uint64_t x_155;
  uint64_t *os_155;
  uint64_t x_154;
  uint64_t *os_154;
  uint64_t x_153;
  uint64_t *os_153;
  uint64_t x_152;
  uint64_t *os_152;
  uint64_t x_151;
  uint64_t *os_151;
  uint64_t x_150;
  uint64_t *os_150;
  uint32_t i_10;
  uint64_t *res_j_10;
  uint64_t c_10;
  uint64_t x_149;
  uint64_t *os_149;
  uint64_t x_148;
  uint64_t *os_148;
  uint64_t x_147;
  uint64_t *os_147;
  uint64_t x_146;
  uint64_t *os_146;
  uint64_t x_145;
  uint64_t *os_145;
  uint64_t x_144;
  uint64_t *os_144;
  uint64_t x_143;
  uint64_t *os_143;
  uint64_t x_142;
  uint64_t *os_142;
  uint64_t x_141;
  uint64_t *os_141;
  uint64_t x_140;
  uint64_t *os_140;
  uint64_t x_139;
  uint64_t *os_139;
  uint64_t x_138;
  uint64_t *os_138;
  uint64_t x_137;
  uint64_t *os_137;
  uint64_t x_136;
  uint64_t *os_136;
  uint64_t x_135;
  uint64_t *os_135;
  uint32_t i_9;
  uint64_t *res_j_9;
  uint64_t c_9;
  uint64_t x_134;
  uint64_t *os_134;
  uint64_t x_133;
  uint64_t *os_133;
  uint64_t x_132;
  uint64_t *os_132;
  uint64_t x_131;
  uint64_t *os_131;
  uint64_t x_130;
  uint64_t *os_130;
  uint64_t x_129;
  uint64_t *os_129;
  uint64_t x_128;
  uint64_t *os_128;
  uint64_t x_127;
  uint64_t *os_127;
  uint64_t x_126;
  uint64_t *os_126;
  uint64_t x_125;
  uint64_t *os_125;
  uint64_t x_124;
  uint64_t *os_124;
  uint64_t x_123;
  uint64_t *os_123;
  uint64_t x_122;
  uint64_t *os_122;
  uint64_t x_121;
  uint64_t *os_121;
  uint64_t x_120;
  uint64_t *os_120;
  uint32_t i_8;
  uint64_t *res_j_8;
  uint64_t c_8;
  uint64_t x_119;
  uint64_t *os_119;
  uint64_t x_118;
  uint64_t *os_118;
  uint64_t x_117;
  uint64_t *os_117;
  uint64_t x_116;
  uint64_t *os_116;
  uint64_t x_115;
  uint64_t *os_115;
  uint64_t x_114;
  uint64_t *os_114;
  uint64_t x_113;
  uint64_t *os_113;
  uint64_t x_112;
  uint64_t *os_112;
  uint64_t x_111;
  uint64_t *os_111;
  uint64_t x_110;
  uint64_t *os_110;
  uint64_t x_109;
  uint64_t *os_109;
  uint64_t x_108;
  uint64_t *os_108;
  uint64_t x_107;
  uint64_t *os_107;
  uint64_t x_106;
  uint64_t *os_106;
  uint64_t x_105;
  uint64_t *os_105;
  uint32_t i_7;
  uint64_t *res_j_7;
  uint64_t c_7;
  uint64_t x_104;
  uint64_t *os_104;
  uint64_t x_103;
  uint64_t *os_103;
  uint64_t x_102;
  uint64_t *os_102;
  uint64_t x_101;
  uint64_t *os_101;
  uint64_t x_100;
  uint64_t *os_100;
  uint64_t x_99;
  uint64_t *os_99;
  uint64_t x_98;
  uint64_t *os_98;
  uint64_t x_97;
  uint64_t *os_97;
  uint64_t x_96;
  uint64_t *os_96;
  uint64_t x_95;
  uint64_t *os_95;
  uint64_t x_94;
  uint64_t *os_94;
  uint64_t x_93;
  uint64_t *os_93;
  uint64_t x_92;
  uint64_t *os_92;
  uint64_t x_91;
  uint64_t *os_91;
  uint64_t x_90;
  uint64_t *os_90;
  uint32_t i_6;
  uint64_t *res_j_6;
  uint64_t c_6;
  uint64_t x_89;
  uint64_t *os_89;
  uint64_t x_88;
  uint64_t *os_88;
  uint64_t x_87;
  uint64_t *os_87;
  uint64_t x_86;
  uint64_t *os_86;
  uint64_t x_85;
  uint64_t *os_85;
  uint64_t x_84;
  uint64_t *os_84;
  uint64_t x_83;
  uint64_t *os_83;
  uint64_t x_82;
  uint64_t *os_82;
  uint64_t x_81;
  uint64_t *os_81;
  uint64_t x_80;
  uint64_t *os_80;
  uint64_t x_79;
  uint64_t *os_79;
  uint64_t x_78;
  uint64_t *os_78;
  uint64_t x_77;
  uint64_t *os_77;
  uint64_t x_76;
  uint64_t *os_76;
  uint64_t x_75;
  uint64_t *os_75;
  uint32_t i_5;
  uint64_t *res_j_5;
  uint64_t c_5;
  uint64_t x_74;
  uint64_t *os_74;
  uint64_t x_73;
  uint64_t *os_73;
  uint64_t x_72;
  uint64_t *os_72;
  uint64_t x_71;
  uint64_t *os_71;
  uint64_t x_70;
  uint64_t *os_70;
  uint64_t x_69;
  uint64_t *os_69;
  uint64_t x_68;
  uint64_t *os_68;
  uint64_t x_67;
  uint64_t *os_67;
  uint64_t x_66;
  uint64_t *os_66;
  uint64_t x_65;
  uint64_t *os_65;
  uint64_t x_64;
  uint64_t *os_64;
  uint64_t x_63;
  uint64_t *os_63;
  uint64_t x_62;
  uint64_t *os_62;
  uint64_t x_61;
  uint64_t *os_61;
  uint64_t x_60;
  uint64_t *os_60;
  uint32_t i_4;
  uint64_t *res_j_4;
  uint64_t c_4;
  uint64_t x_59;
  uint64_t *os_59;
  uint64_t x_58;
  uint64_t *os_58;
  uint64_t x_57;
  uint64_t *os_57;
  uint64_t x_56;
  uint64_t *os_56;
  uint64_t x_55;
  uint64_t *os_55;
  uint64_t x_54;
  uint64_t *os_54;
  uint64_t x_53;
  uint64_t *os_53;
  uint64_t x_52;
  uint64_t *os_52;
  uint64_t x_51;
  uint64_t *os_51;
  uint64_t x_50;
  uint64_t *os_50;
  uint64_t x_49;
  uint64_t *os_49;
  uint64_t x_48;
  uint64_t *os_48;
  uint64_t x_47;
  uint64_t *os_47;
  uint64_t x_46;
  uint64_t *os_46;
  uint64_t x_45;
  uint64_t *os_45;
  uint32_t i_3;
  uint64_t *res_j_3;
  uint64_t c_3;
  uint64_t x_44;
  uint64_t *os_44;
  uint64_t x_43;
  uint64_t *os_43;
  uint64_t x_42;
  uint64_t *os_42;
  uint64_t x_41;
  uint64_t *os_41;
  uint64_t x_40;
  uint64_t *os_40;
  uint64_t x_39;
  uint64_t *os_39;
  uint64_t x_38;
  uint64_t *os_38;
  uint64_t x_37;
  uint64_t *os_37;
  uint64_t x_36;
  uint64_t *os_36;
  uint64_t x_35;
  uint64_t *os_35;
  uint64_t x_34;
  uint64_t *os_34;
  uint64_t x_33;
  uint64_t *os_33;
  uint64_t x_32;
  uint64_t *os_32;
  uint64_t x_31;
  uint64_t *os_31;
  uint64_t x_30;
  uint64_t *os_30;
  uint32_t i_2;
  uint64_t *res_j_2;
  uint64_t c_2;
  uint64_t x_29;
  uint64_t *os_29;
  uint64_t x_28;
  uint64_t *os_28;
  uint64_t x_27;
  uint64_t *os_27;
  uint64_t x_26;
  uint64_t *os_26;
  uint64_t x_25;
  uint64_t *os_25;
  uint64_t x_24;
  uint64_t *os_24;
  uint64_t x_23;
  uint64_t *os_23;
  uint64_t x_22;
  uint64_t *os_22;
  uint64_t x_21;
  uint64_t *os_21;
  uint64_t x_20;
  uint64_t *os_20;
  uint64_t x_19;
  uint64_t *os_19;
  uint64_t x_18;
  uint64_t *os_18;
  uint64_t x_17;
  uint64_t *os_17;
  uint64_t x_16;
  uint64_t *os_16;
  uint64_t x_15;
  uint64_t *os_15;
  uint32_t i_1;
  uint64_t *res_j_1;
  uint64_t c_1;
  uint64_t x_14;
  uint64_t *os_14;
  uint64_t x_13;
  uint64_t *os_13;
  uint64_t x_12;
  uint64_t *os_12;
  uint64_t x_11;
  uint64_t *os_11;
  uint64_t x_10;
  uint64_t *os_10;
  uint64_t x_9;
  uint64_t *os_9;
  uint64_t x_8;
  uint64_t *os_8;
  uint64_t x_7;
  uint64_t *os_7;
  uint64_t x_6;
  uint64_t *os_6;
  uint64_t x_5;
  uint64_t *os_5;
  uint64_t x_4;
  uint64_t *os_4;
  uint64_t x_3;
  uint64_t *os_3;
  uint64_t x_2;
  uint64_t *os_2;
  uint64_t x_1;
  uint64_t *os_1;
  uint64_t x;
  uint64_t *os;
  uint32_t i;
  uint64_t *res_j;
  uint64_t c;
  uint32_t i0;
  uint64_t *tmp_local;
  uint64_t bits_l_local;
  uint64_t *table_local;
  
  memcpy(tmp,table,0x78);
  uVar1 = FStar_UInt64_eq_mask(bits_l,1);
  *tmp = uVar1 & table[0xf] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x10] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x11] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x12] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x13] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x14] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x15] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x16] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x17] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x18] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x19] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x1a] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x1b] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x1c] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x1d] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,2);
  *tmp = uVar1 & table[0x1e] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x1f] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x20] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x21] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x22] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x23] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x24] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x25] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x26] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x27] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x28] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x29] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x2a] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x2b] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x2c] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,3);
  *tmp = uVar1 & table[0x2d] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x2e] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x2f] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x30] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x31] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x32] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x33] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x34] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x35] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x36] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x37] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x38] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x39] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x3a] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x3b] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,4);
  *tmp = uVar1 & table[0x3c] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x3d] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x3e] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x3f] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x40] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x41] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x42] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x43] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x44] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x45] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x46] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x47] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x48] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x49] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x4a] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,5);
  *tmp = uVar1 & table[0x4b] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x4c] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x4d] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x4e] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x4f] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x50] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x51] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x52] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x53] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x54] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x55] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x56] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x57] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x58] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x59] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,6);
  *tmp = uVar1 & table[0x5a] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x5b] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x5c] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x5d] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x5e] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x5f] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x60] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x61] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x62] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[99] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[100] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x65] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x66] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x67] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x68] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,7);
  *tmp = uVar1 & table[0x69] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x6a] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x6b] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x6c] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x6d] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x6e] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x6f] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x70] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x71] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x72] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x73] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x74] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x75] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x76] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x77] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,8);
  *tmp = uVar1 & table[0x78] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x79] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x7a] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x7b] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x7c] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x7d] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x7e] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x7f] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x80] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x81] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x82] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x83] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x84] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x85] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x86] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,9);
  *tmp = uVar1 & table[0x87] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x88] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x89] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x8a] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x8b] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x8c] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x8d] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x8e] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x8f] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x90] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0x91] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0x92] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0x93] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0x94] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0x95] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,10);
  *tmp = uVar1 & table[0x96] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0x97] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0x98] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0x99] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0x9a] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0x9b] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0x9c] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0x9d] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0x9e] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0x9f] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xa0] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xa1] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xa2] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xa3] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xa4] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xb);
  *tmp = uVar1 & table[0xa5] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0xa6] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0xa7] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0xa8] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0xa9] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0xaa] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0xab] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0xac] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0xad] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0xae] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xaf] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xb0] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xb1] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xb2] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xb3] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xc);
  *tmp = uVar1 & table[0xb4] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0xb5] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0xb6] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0xb7] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0xb8] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0xb9] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0xba] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0xbb] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0xbc] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0xbd] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xbe] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xbf] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xc0] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xc1] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xc2] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xd);
  *tmp = uVar1 & table[0xc3] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0xc4] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0xc5] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0xc6] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[199] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[200] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0xc9] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0xca] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0xcb] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0xcc] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xcd] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xce] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xcf] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xd0] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xd1] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xe);
  *tmp = uVar1 & table[0xd2] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0xd3] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0xd4] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0xd5] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0xd6] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0xd7] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0xd8] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0xd9] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0xda] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0xdb] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xdc] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xdd] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xde] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xdf] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xe0] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  uVar1 = FStar_UInt64_eq_mask(bits_l,0xf);
  *tmp = uVar1 & table[0xe1] | (uVar1 ^ 0xffffffffffffffff) & *tmp;
  tmp[1] = uVar1 & table[0xe2] | (uVar1 ^ 0xffffffffffffffff) & tmp[1];
  tmp[2] = uVar1 & table[0xe3] | (uVar1 ^ 0xffffffffffffffff) & tmp[2];
  tmp[3] = uVar1 & table[0xe4] | (uVar1 ^ 0xffffffffffffffff) & tmp[3];
  tmp[4] = uVar1 & table[0xe5] | (uVar1 ^ 0xffffffffffffffff) & tmp[4];
  tmp[5] = uVar1 & table[0xe6] | (uVar1 ^ 0xffffffffffffffff) & tmp[5];
  tmp[6] = uVar1 & table[0xe7] | (uVar1 ^ 0xffffffffffffffff) & tmp[6];
  tmp[7] = uVar1 & table[0xe8] | (uVar1 ^ 0xffffffffffffffff) & tmp[7];
  tmp[8] = uVar1 & table[0xe9] | (uVar1 ^ 0xffffffffffffffff) & tmp[8];
  tmp[9] = uVar1 & table[0xea] | (uVar1 ^ 0xffffffffffffffff) & tmp[9];
  tmp[10] = uVar1 & table[0xeb] | (uVar1 ^ 0xffffffffffffffff) & tmp[10];
  tmp[0xb] = uVar1 & table[0xec] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xb];
  tmp[0xc] = uVar1 & table[0xed] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xc];
  tmp[0xd] = uVar1 & table[0xee] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xd];
  tmp[0xe] = uVar1 & table[0xef] | (uVar1 ^ 0xffffffffffffffff) & tmp[0xe];
  return;
}

Assistant:

static inline void precomp_get_consttime(const uint64_t *table, uint64_t bits_l, uint64_t *tmp)
{
  memcpy(tmp, (uint64_t *)table, 12U * sizeof (uint64_t));
  KRML_MAYBE_FOR15(i0,
    0U,
    15U,
    1U,
    uint64_t c = FStar_UInt64_eq_mask(bits_l, (uint64_t)(i0 + 1U));
    const uint64_t *res_j = table + (i0 + 1U) * 12U;
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint64_t *os = tmp;
      uint64_t x = (c & res_j[i]) | (~c & tmp[i]);
      os[i] = x;););
}